

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_time.h
# Opt level: O0

basic_ostream<char,_std::char_traits<char>_> *
booster::locale::operator<<(basic_ostream<char,_std::char_traits<char>_> *out,date_time *t)

{
  long lVar1;
  ulong uVar2;
  basic_ostream<char,_std::char_traits<char>_> *in_RDI;
  double dVar3;
  uint64_t display_flags;
  double time_point;
  
  dVar3 = (double)booster::locale::date_time::time();
  booster::locale::ios_info::get((ios_base *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)));
  lVar1 = booster::locale::ios_info::display_flags();
  if ((((lVar1 == 4) || (lVar1 == 5)) || (lVar1 == 6)) || (lVar1 == 7)) {
    std::ostream::operator<<(in_RDI,dVar3);
  }
  else {
    uVar2 = booster::locale::ios_info::get
                      ((ios_base *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)));
    booster::locale::ios_info::display_flags(uVar2);
    std::ostream::operator<<(in_RDI,dVar3);
    uVar2 = booster::locale::ios_info::get
                      ((ios_base *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)));
    booster::locale::ios_info::display_flags(uVar2);
  }
  return in_RDI;
}

Assistant:

std::basic_ostream<CharType> &operator<<(std::basic_ostream<CharType> &out,date_time const &t)
        {
            double time_point = t.time();
            uint64_t display_flags = ios_info::get(out).display_flags();
            if  (
                    display_flags == flags::date 
                    || display_flags == flags::time 
                    || display_flags == flags::datetime 
                    || display_flags == flags::strftime
                ) 
            {
                out << time_point;
            }
            else {
                ios_info::get(out).display_flags(flags::datetime);
                out << time_point;
                ios_info::get(out).display_flags(display_flags);
            }
            return out;
        }